

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

int anon_unknown.dwarf_2b097::CategorizedHelpPrinter::OptionCategoryCompare
              (OptionCategory **A,OptionCategory **B)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong __n;
  
  uVar1 = ((*A)->Name).Length;
  uVar2 = ((*B)->Name).Length;
  __n = uVar1;
  if (uVar2 < uVar1) {
    __n = uVar2;
  }
  if ((__n == 0) || (iVar3 = memcmp(((*A)->Name).Data,((*B)->Name).Data,__n), iVar3 == 0)) {
    if (uVar1 == uVar2) {
      return 0;
    }
    uVar4 = -(uint)(uVar1 < uVar2);
  }
  else {
    uVar4 = iVar3 >> 0x1f;
  }
  return uVar4 | 1;
}

Assistant:

static int OptionCategoryCompare(OptionCategory *const *A,
                                   OptionCategory *const *B) {
    return (*A)->getName().compare((*B)->getName());
  }